

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

sunrealtype N_VDotProd_Serial(N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  sunrealtype sVar3;
  
  lVar1 = *x->content;
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  sVar3 = 0.0;
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    sVar3 = sVar3 + *(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8) *
                    *(double *)(*(long *)((long)y->content + 0x10) + lVar2 * 8);
  }
  return sVar3;
}

Assistant:

sunrealtype N_VDotProd_Serial(N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype sum, *xd, *yd;

  sum = ZERO;
  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  for (i = 0; i < N; i++) { sum += xd[i] * yd[i]; }

  return (sum);
}